

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O1

void Disconnect_Fields(FORM *form)

{
  FIELD *pFVar1;
  FIELD **ppFVar2;
  
  ppFVar2 = form->field;
  if (ppFVar2 != (FIELD **)0x0) {
    pFVar1 = *ppFVar2;
    while (pFVar1 != (FIELD *)0x0) {
      ppFVar2 = ppFVar2 + 1;
      if (pFVar1->form == form) {
        pFVar1->form = (formnode *)0x0;
      }
      pFVar1 = *ppFVar2;
    }
    form->rows = 0;
    form->cols = 0;
    form->maxfield = -1;
    form->maxpage = -1;
    form->field = (FIELD **)0x0;
    if (form->page != (_PAGE *)0x0) {
      free(form->page);
    }
    form->page = (_PAGE *)0x0;
  }
  return;
}

Assistant:

static void Disconnect_Fields( FORM * form )
{
  if (form->field)
    {
      FIELD **fields;

      for(fields=form->field;*fields;fields++)
	{
	  if (form == (*fields)->form) 
	    (*fields)->form = (FORM *)0;
	}
      
      form->rows = form->cols = 0;
      form->maxfield = form->maxpage = -1;
      form->field = (FIELD **)0;
      if (form->page) 
	free(form->page);
      form->page = (_PAGE *)0;
    }	
}